

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_list.c
# Opt level: O0

int qc_list_inserttail(QcList *list,void *data)

{
  QcListEntry *__s;
  QcListEntry *entry;
  void *data_local;
  QcList *list_local;
  
  if (list == (QcList *)0x0) {
    fprintf(_stderr,"stderr: assert throw. [%s  line:%d]\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_list.c"
            ,0x207);
    __assert_fail("list",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_list.c"
                  ,0x207,"int qc_list_inserttail(QcList *, void *)");
  }
  if (data != (void *)0x0) {
    __s = (QcListEntry *)malloc(0x18);
    if (__s == (QcListEntry *)0x0) {
      fprintf(_stderr,"malloc failed. [%s  line:%d]\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_list.c"
              ,0x20a);
      __assert_fail("entry",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_list.c"
                    ,0x20a,"int qc_list_inserttail(QcList *, void *)");
    }
    memset(__s,0,0x18);
    if (__s == (QcListEntry *)0x0) {
      list_local._4_4_ = -1;
    }
    else {
      __s->data = data;
      __s->next = (QcListEntry *)0x0;
      __s->prev = list->tail;
      if (list->tail == (QcListEntry *)0x0) {
        list->head = __s;
      }
      else {
        list->tail->next = __s;
      }
      list->tail = __s;
      list->count = list->count + 1;
      list_local._4_4_ = 0;
    }
    return list_local._4_4_;
  }
  fprintf(_stderr,"stderr: assert throw. [%s  line:%d]\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_list.c"
          ,0x208);
  __assert_fail("data",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_list.c"
                ,0x208,"int qc_list_inserttail(QcList *, void *)");
}

Assistant:

int	qc_list_inserttail(QcList *list, void *data)
{
    QcListEntry *entry;

    qc_assert(list);
    qc_assert(data);

    qc_malloc(entry, sizeof(struct __QcListEntry));
    if(!entry)
    {
        return -1;
    }

    entry->data = data;
    entry->next = NULL;

    entry->prev = list->tail;

    if(!list->tail)
    {
        list->head = entry;
    }
    else
    {
        list->tail->next = entry;
    }

    list->tail = entry;
    list->count++;
    
    return 0;
}